

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_11;
  float *p0_11;
  int kk_10;
  float *p0_10;
  int kk_9;
  float *p0_9;
  int kk_8;
  float *p0_8;
  __m128 _tmp1_3;
  __m128 _tmp0_3;
  __m128 _r1_5;
  __m128 _r0_5;
  int kk_7;
  float *p0_7;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_6;
  float *p0_6;
  int kk_5;
  float *p0_5;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  int kk_4;
  float *p0_4;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_3;
  float *p0_3;
  int kk_2;
  float *p0_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r7_1;
  __m128 _r6_1;
  __m128 _r5_1;
  __m128 _r4_1;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  int kk_1;
  float *p0_1;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int kk;
  float *p0;
  int ii;
  float *pp;
  int A_hstep;
  int elempack;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  int local_16d0;
  int local_16cc;
  undefined4 *local_16c8;
  int local_16bc;
  undefined1 (*local_16b8) [16];
  int local_16ac;
  undefined1 (*local_16a8) [32];
  int local_169c;
  undefined4 *local_1698;
  undefined8 local_1680;
  undefined8 uStack_1678;
  int local_164c;
  undefined1 (*local_1648) [16];
  int local_15ec;
  undefined1 (*local_15e8) [32];
  int local_15dc;
  undefined1 (*local_15d8) [16];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  int local_154c;
  undefined1 (*local_1548) [16];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  int local_14ac;
  undefined1 (*local_14a8) [32];
  int local_149c;
  undefined1 (*local_1498) [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  int local_138c;
  undefined1 (*local_1388) [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  int local_1264;
  undefined1 (*local_1260) [32];
  int local_1254;
  undefined1 (*local_1250) [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_400;
  undefined8 uStack_3f8;
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_16d0 = (int)in_RDI[8];
  }
  else {
    local_16d0 = *(int *)((long)in_RDI + 0x2c);
  }
  local_1250 = (undefined1 (*) [32])*in_RSI;
  for (local_1254 = 0; local_1254 + 7 < in_ECX; local_1254 = local_1254 + 8) {
    if (iVar1 == 8) {
      local_1260 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 8) * 4);
      for (local_1264 = 0; local_1264 + 7 < in_R9D; local_1264 = local_1264 + 8) {
        auVar17 = vunpcklps_avx(*local_1260,local_1260[1]);
        auVar5 = vunpckhps_avx(*local_1260,local_1260[1]);
        auVar18 = vunpcklps_avx(local_1260[2],local_1260[3]);
        auVar6 = vunpckhps_avx(local_1260[2],local_1260[3]);
        auVar19 = vunpcklps_avx(local_1260[4],local_1260[5]);
        auVar7 = vunpckhps_avx(local_1260[4],local_1260[5]);
        auVar20 = vunpcklps_avx(local_1260[6],local_1260[7]);
        auVar8 = vunpckhps_avx(local_1260[6],local_1260[7]);
        auVar12 = vunpcklpd_avx(auVar17,auVar18);
        auVar17 = vunpckhpd_avx(auVar17,auVar18);
        auVar18 = vunpcklpd_avx(auVar5,auVar6);
        auVar5 = vunpckhpd_avx(auVar5,auVar6);
        auVar13 = vunpcklpd_avx(auVar19,auVar20);
        auVar6 = vunpckhpd_avx(auVar19,auVar20);
        auVar19 = vunpcklpd_avx(auVar7,auVar8);
        auVar7 = vunpckhpd_avx(auVar7,auVar8);
        local_1060 = auVar12._0_8_;
        uStack_1058 = auVar12._8_8_;
        local_10e0 = auVar13._0_8_;
        uStack_10d8 = auVar13._8_8_;
        local_1080 = auVar17._0_8_;
        uStack_1078 = auVar17._8_8_;
        local_1100 = auVar6._0_8_;
        uStack_10f8 = auVar6._8_8_;
        local_10a0 = auVar18._0_8_;
        uStack_1098 = auVar18._8_8_;
        local_1120 = auVar19._0_8_;
        uStack_1118 = auVar19._8_8_;
        local_10c0 = auVar5._0_8_;
        uStack_10b8 = auVar5._8_8_;
        local_1140 = auVar7._0_8_;
        uStack_1138 = auVar7._8_8_;
        auVar8 = vperm2f128_avx(auVar12,auVar13,0x31);
        uStack_1308 = auVar8._24_8_;
        uStack_1310 = auVar8._16_8_;
        uStack_1318 = auVar8._8_8_;
        local_1320 = auVar8._0_8_;
        auVar17 = vperm2f128_avx(auVar17,auVar6,0x31);
        uStack_1328 = auVar17._24_8_;
        uStack_1330 = auVar17._16_8_;
        uStack_1338 = auVar17._8_8_;
        local_1340 = auVar17._0_8_;
        auVar17 = vperm2f128_avx(auVar18,auVar19,0x31);
        uStack_1348 = auVar17._24_8_;
        uStack_1350 = auVar17._16_8_;
        uStack_1358 = auVar17._8_8_;
        local_1360 = auVar17._0_8_;
        auVar17 = vperm2f128_avx(auVar5,auVar7,0x31);
        *(undefined8 *)*local_1250 = local_1060;
        *(undefined8 *)(*local_1250 + 8) = uStack_1058;
        *(undefined8 *)(*local_1250 + 0x10) = local_10e0;
        *(undefined8 *)(*local_1250 + 0x18) = uStack_10d8;
        *(undefined8 *)local_1250[1] = local_1080;
        *(undefined8 *)(local_1250[1] + 8) = uStack_1078;
        *(undefined8 *)(local_1250[1] + 0x10) = local_1100;
        *(undefined8 *)(local_1250[1] + 0x18) = uStack_10f8;
        *(undefined8 *)local_1250[2] = local_10a0;
        *(undefined8 *)(local_1250[2] + 8) = uStack_1098;
        *(undefined8 *)(local_1250[2] + 0x10) = local_1120;
        *(undefined8 *)(local_1250[2] + 0x18) = uStack_1118;
        *(undefined8 *)local_1250[3] = local_10c0;
        *(undefined8 *)(local_1250[3] + 8) = uStack_10b8;
        *(undefined8 *)(local_1250[3] + 0x10) = local_1140;
        *(undefined8 *)(local_1250[3] + 0x18) = uStack_1138;
        *(undefined8 *)local_1250[4] = local_1320;
        *(undefined8 *)(local_1250[4] + 8) = uStack_1318;
        *(undefined8 *)(local_1250[4] + 0x10) = uStack_1310;
        *(undefined8 *)(local_1250[4] + 0x18) = uStack_1308;
        *(undefined8 *)local_1250[5] = local_1340;
        *(undefined8 *)(local_1250[5] + 8) = uStack_1338;
        *(undefined8 *)(local_1250[5] + 0x10) = uStack_1330;
        *(undefined8 *)(local_1250[5] + 0x18) = uStack_1328;
        *(undefined8 *)local_1250[6] = local_1360;
        *(undefined8 *)(local_1250[6] + 8) = uStack_1358;
        *(undefined8 *)(local_1250[6] + 0x10) = uStack_1350;
        *(undefined8 *)(local_1250[6] + 0x18) = uStack_1348;
        local_1250[7] = auVar17;
        local_1250 = local_1250 + 8;
        local_1260 = (undefined1 (*) [32])(*local_1260 + (long)(local_16d0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_1388 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 4) * 4);
      for (local_138c = 0; local_138c + 3 < in_R9D; local_138c = local_138c + 4) {
        auVar14 = vunpcklps_avx(*local_1388,local_1388[1]);
        auVar15 = vunpcklps_avx(local_1388[2],local_1388[3]);
        auVar2 = vunpckhps_avx(*local_1388,local_1388[1]);
        auVar3 = vunpckhps_avx(local_1388[2],local_1388[3]);
        auVar9 = vunpcklpd_avx(auVar14,auVar15);
        auVar14 = vunpckhpd_avx(auVar14,auVar15);
        auVar10 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(local_1388[4],local_1388[5]);
        auVar16 = vunpcklps_avx(local_1388[6],local_1388[7]);
        auVar15 = vunpckhps_avx(local_1388[4],local_1388[5]);
        auVar4 = vunpckhps_avx(local_1388[6],local_1388[7]);
        auVar11 = vunpcklpd_avx(auVar3,auVar16);
        auVar3 = vunpckhpd_avx(auVar3,auVar16);
        auVar16 = vunpcklpd_avx(auVar15,auVar4);
        auVar15 = vunpckhpd_avx(auVar15,auVar4);
        local_13a0 = auVar9._0_8_;
        uStack_1398 = auVar9._8_8_;
        *(undefined8 *)*local_1250 = local_13a0;
        *(undefined8 *)(*local_1250 + 8) = uStack_1398;
        local_13e0 = auVar11._0_8_;
        uStack_13d8 = auVar11._8_8_;
        *(undefined8 *)(*local_1250 + 0x10) = local_13e0;
        *(undefined8 *)(*local_1250 + 0x18) = uStack_13d8;
        local_13b0 = auVar14._0_8_;
        uStack_13a8 = auVar14._8_8_;
        *(undefined8 *)local_1250[1] = local_13b0;
        *(undefined8 *)(local_1250[1] + 8) = uStack_13a8;
        local_13f0 = auVar3._0_8_;
        uStack_13e8 = auVar3._8_8_;
        *(undefined8 *)(local_1250[1] + 0x10) = local_13f0;
        *(undefined8 *)(local_1250[1] + 0x18) = uStack_13e8;
        local_13c0 = auVar10._0_8_;
        uStack_13b8 = auVar10._8_8_;
        *(undefined8 *)local_1250[2] = local_13c0;
        *(undefined8 *)(local_1250[2] + 8) = uStack_13b8;
        local_1400 = auVar16._0_8_;
        uStack_13f8 = auVar16._8_8_;
        *(undefined8 *)(local_1250[2] + 0x10) = local_1400;
        *(undefined8 *)(local_1250[2] + 0x18) = uStack_13f8;
        local_13d0 = auVar2._0_8_;
        uStack_13c8 = auVar2._8_8_;
        *(undefined8 *)local_1250[3] = local_13d0;
        *(undefined8 *)(local_1250[3] + 8) = uStack_13c8;
        *(undefined1 (*) [16])(local_1250[3] + 0x10) = auVar15;
        local_1250 = local_1250 + 4;
        local_1388 = (undefined1 (*) [16])(*local_1388 + (long)(local_16d0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_1498 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 + (long)(in_EDX + local_1254) * 4);
      for (local_149c = 0; local_149c < in_R9D; local_149c = local_149c + 1) {
        *local_1250 = *local_1498;
        local_1250 = local_1250 + 1;
        local_1498 = (undefined1 (*) [32])(*local_1498 + (long)local_16d0 * 4);
      }
    }
  }
  for (; local_1254 + 3 < in_ECX; local_1254 = local_1254 + 4) {
    if (iVar1 == 8) {
      local_14a8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 8) * 4);
      for (local_14ac = 0; local_14ac + 7 < in_R9D; local_14ac = local_14ac + 8) {
        auVar17 = vunpcklps_avx(*local_14a8,local_14a8[1]);
        auVar5 = vunpckhps_avx(*local_14a8,local_14a8[1]);
        auVar8 = vunpcklps_avx(local_14a8[2],local_14a8[3]);
        auVar6 = vunpckhps_avx(local_14a8[2],local_14a8[3]);
        auVar7 = vunpcklpd_avx(auVar17,auVar8);
        auVar17 = vunpckhpd_avx(auVar17,auVar8);
        auVar8 = vunpcklpd_avx(auVar5,auVar6);
        auVar5 = vunpckhpd_avx(auVar5,auVar6);
        local_500 = auVar7._0_8_;
        uStack_4f8 = auVar7._8_8_;
        local_520 = auVar17._0_8_;
        uStack_518 = auVar17._8_8_;
        local_540 = auVar8._0_8_;
        uStack_538 = auVar8._8_8_;
        local_560 = auVar5._0_8_;
        uStack_558 = auVar5._8_8_;
        auVar17 = vperm2f128_avx(auVar7,auVar17,0x31);
        uStack_1508 = auVar17._24_8_;
        uStack_1510 = auVar17._16_8_;
        uStack_1518 = auVar17._8_8_;
        local_1520 = auVar17._0_8_;
        auVar17 = vperm2f128_avx(auVar8,auVar5,0x31);
        *(undefined8 *)*local_1250 = local_500;
        *(undefined8 *)(*local_1250 + 8) = uStack_4f8;
        *(undefined8 *)(*local_1250 + 0x10) = local_520;
        *(undefined8 *)(*local_1250 + 0x18) = uStack_518;
        *(undefined8 *)local_1250[1] = local_540;
        *(undefined8 *)(local_1250[1] + 8) = uStack_538;
        *(undefined8 *)(local_1250[1] + 0x10) = local_560;
        *(undefined8 *)(local_1250[1] + 0x18) = uStack_558;
        *(undefined8 *)local_1250[2] = local_1520;
        *(undefined8 *)(local_1250[2] + 8) = uStack_1518;
        *(undefined8 *)(local_1250[2] + 0x10) = uStack_1510;
        *(undefined8 *)(local_1250[2] + 0x18) = uStack_1508;
        local_1250[3] = auVar17;
        local_1250 = local_1250 + 4;
        local_14a8 = (undefined1 (*) [32])(*local_14a8 + (long)(local_16d0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_1548 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 4) * 4);
      for (local_154c = 0; local_154c + 3 < in_R9D; local_154c = local_154c + 4) {
        auVar14 = vunpcklps_avx(*local_1548,local_1548[1]);
        auVar4 = vunpcklps_avx(local_1548[2],local_1548[3]);
        auVar2 = vunpckhps_avx(*local_1548,local_1548[1]);
        auVar3 = vunpckhps_avx(local_1548[2],local_1548[3]);
        auVar15 = vunpcklpd_avx(auVar14,auVar4);
        auVar14 = vunpckhpd_avx(auVar14,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_1560 = auVar15._0_8_;
        uStack_1558 = auVar15._8_8_;
        *(undefined8 *)*local_1250 = local_1560;
        *(undefined8 *)(*local_1250 + 8) = uStack_1558;
        local_1570 = auVar14._0_8_;
        uStack_1568 = auVar14._8_8_;
        *(undefined8 *)(*local_1250 + 0x10) = local_1570;
        *(undefined8 *)(*local_1250 + 0x18) = uStack_1568;
        local_1580 = auVar4._0_8_;
        uStack_1578 = auVar4._8_8_;
        *(undefined8 *)local_1250[1] = local_1580;
        *(undefined8 *)(local_1250[1] + 8) = uStack_1578;
        *(undefined1 (*) [16])(local_1250[1] + 0x10) = auVar2;
        local_1250 = local_1250 + 2;
        local_1548 = (undefined1 (*) [16])(*local_1548 + (long)(local_16d0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_15d8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 + (long)(in_EDX + local_1254) * 4);
      for (local_15dc = 0; local_15dc < in_R9D; local_15dc = local_15dc + 1) {
        *(undefined1 (*) [16])*local_1250 = *local_15d8;
        local_1250 = (undefined1 (*) [32])(*local_1250 + 0x10);
        local_15d8 = (undefined1 (*) [16])(*local_15d8 + (long)local_16d0 * 4);
      }
    }
  }
  for (; local_1254 + 1 < in_ECX; local_1254 = local_1254 + 2) {
    if (iVar1 == 8) {
      local_15e8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 8) * 4);
      for (local_15ec = 0; local_15ec + 7 < in_R9D; local_15ec = local_15ec + 8) {
        auVar5 = vunpcklps_avx(*local_15e8,local_15e8[1]);
        auVar17 = vunpckhps_avx(*local_15e8,local_15e8[1]);
        local_400 = auVar5._0_8_;
        uStack_3f8 = auVar5._8_8_;
        local_420 = auVar17._0_8_;
        uStack_418 = auVar17._8_8_;
        auVar17 = vperm2f128_avx(auVar5,auVar17,0x31);
        *(undefined8 *)*local_1250 = local_400;
        *(undefined8 *)(*local_1250 + 8) = uStack_3f8;
        *(undefined8 *)(*local_1250 + 0x10) = local_420;
        *(undefined8 *)(*local_1250 + 0x18) = uStack_418;
        local_1250[1] = auVar17;
        local_1250 = local_1250 + 2;
        local_15e8 = (undefined1 (*) [32])(*local_15e8 + (long)(local_16d0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_1648 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 4) * 4);
      for (local_164c = 0; local_164c + 3 < in_R9D; local_164c = local_164c + 4) {
        auVar2 = vunpcklps_avx(*local_1648,local_1648[1]);
        auVar14 = vunpckhps_avx(*local_1648,local_1648[1]);
        local_1680 = auVar2._0_8_;
        uStack_1678 = auVar2._8_8_;
        *(undefined8 *)*local_1250 = local_1680;
        *(undefined8 *)(*local_1250 + 8) = uStack_1678;
        *(undefined1 (*) [16])(*local_1250 + 0x10) = auVar14;
        local_1250 = local_1250 + 1;
        local_1648 = (undefined1 (*) [16])(*local_1648 + (long)(local_16d0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_1698 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 + (long)(in_EDX + local_1254) * 4);
      for (local_169c = 0; local_169c < in_R9D; local_169c = local_169c + 1) {
        *(undefined4 *)*local_1250 = *local_1698;
        *(undefined4 *)(*local_1250 + 4) = local_1698[1];
        local_1250 = (undefined1 (*) [32])(*local_1250 + 8);
        local_1698 = local_1698 + local_16d0;
      }
    }
  }
  for (; local_1254 < in_ECX; local_1254 = local_1254 + 1) {
    if (iVar1 == 8) {
      local_16a8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 8) * 4);
      for (local_16ac = 0; local_16ac + 7 < in_R9D; local_16ac = local_16ac + 8) {
        *local_1250 = *local_16a8;
        local_1250 = local_1250 + 1;
        local_16a8 = (undefined1 (*) [32])(*local_16a8 + (long)(local_16d0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_16b8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 +
                   (long)((in_EDX + local_1254) * 4) * 4);
      for (local_16bc = 0; local_16bc + 3 < in_R9D; local_16bc = local_16bc + 4) {
        *(undefined1 (*) [16])*local_1250 = *local_16b8;
        local_1250 = (undefined1 (*) [32])(*local_1250 + 0x10);
        local_16b8 = (undefined1 (*) [16])(*local_16b8 + (long)(local_16d0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_16c8 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_16d0) * 4 + (long)(in_EDX + local_1254) * 4);
      for (local_16cc = 0; local_16cc < in_R9D; local_16cc = local_16cc + 1) {
        *(undefined4 *)*local_1250 = *local_16c8;
        local_1250 = (undefined1 (*) [32])(*local_1250 + 4);
        local_16c8 = local_16c8 + local_16d0;
      }
    }
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}